

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RndFun.cpp
# Opt level: O2

void PrintSarrBytes(Sarray *A)

{
  ulong uVar1;
  bool bVar2;
  ostream *this;
  long lVar3;
  int y;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  bVar2 = true;
  for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
    bVar6 = bVar2;
    for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
      for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 8) {
        uVar1 = *(ulong *)(*(long *)&(A->
                                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[lVar3].
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data + lVar4 * 8);
        *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 2;
        this = std::operator<<(&std::cout,0x30);
        *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x18) =
             *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(this,(uint)(uVar1 >> ((byte)lVar5 & 0x3f)) & 0xff);
      }
      if (bVar6) {
        std::operator<<((ostream *)&std::cout,' ');
      }
      else {
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
      bVar6 = (bool)(bVar6 ^ 1);
    }
    bVar2 = (bool)(bVar2 ^ 1);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void PrintSarrBytes(Sarray A){
    bool b = true;
    for(int y = 0; y < 5; y++){
        for(int x = 0; x < 5; x++){
            for(int i = 0; i < 8; i ++){
                uint64_t a = A[x][y] >> (8*i);
                int x = a&255;
                cout <<  setw(2) << setfill('0') << hex << x;
            }
            if(b){cout << ' ';}
            else{ cout << endl;}
            b = !b;
        }

    }
    cout << endl;
}